

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

bool __thiscall vmips::callfunc::used_register(callfunc *this,shared_ptr<vmips::VirtReg> *reg)

{
  VirtReg *this_00;
  pointer psVar1;
  bool bVar2;
  pointer psVar3;
  long lVar4;
  pointer psVar5;
  
  this_00 = (this->ret).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00 != (VirtReg *)0x0) &&
     (bVar2 = VirtReg::operator==(this_00,(reg->
                                          super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr), bVar2)) {
    return true;
  }
  psVar3 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar1 - (long)psVar3 >> 6;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    psVar3 = psVar3 + 2;
    do {
      psVar5 = psVar3;
      bVar2 = VirtReg::operator==(psVar5[-2].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar5 = psVar5 + -2;
        goto LAB_0011bd81;
      }
      bVar2 = VirtReg::operator==(psVar5[-1].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar5 = psVar5 + -1;
        goto LAB_0011bd81;
      }
      bVar2 = VirtReg::operator==((psVar5->
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) goto LAB_0011bd81;
      bVar2 = VirtReg::operator==(psVar5[1].
                                  super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(reg->
                                         super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
      if (bVar2) {
        psVar5 = psVar5 + 1;
        goto LAB_0011bd81;
      }
      lVar4 = lVar4 + -1;
      psVar3 = psVar5 + 4;
    } while (1 < lVar4);
    psVar3 = psVar5 + 2;
  }
  lVar4 = (long)psVar1 - (long)psVar3 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      psVar5 = psVar1;
      if ((lVar4 != 3) ||
         (bVar2 = VirtReg::operator==((psVar3->
                                      super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr,(reg->
                                               super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr), psVar5 = psVar3, bVar2))
      goto LAB_0011bd81;
      psVar3 = psVar3 + 1;
    }
    bVar2 = VirtReg::operator==((psVar3->
                                super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr,(reg->
                                       super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr);
    psVar5 = psVar3;
    if (bVar2) goto LAB_0011bd81;
    psVar3 = psVar3 + 1;
  }
  bVar2 = VirtReg::operator==((psVar3->
                              super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              ,(reg->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
  psVar5 = psVar3;
  if (!bVar2) {
    psVar5 = psVar1;
  }
LAB_0011bd81:
  return psVar5 != psVar1;
}

Assistant:

bool callfunc::used_register(const std::shared_ptr<VirtReg> &reg) const {
    if (ret && *ret == *reg) return true;
    return std::any_of(call_with.begin(), call_with.end(),
                       [&](const std::shared_ptr<VirtReg> &t) { return *t == *reg; });
}